

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImGuiViewportP *
ImGui::AddUpdateViewport
          (ImGuiWindow *window,ImGuiID id,ImVec2 *pos,ImVec2 *size,ImGuiViewportFlags flags)

{
  int *piVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  ImVec2 IVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  ImGuiViewportP **ppIVar7;
  ImGuiContext *pIVar8;
  int iVar9;
  long lVar10;
  ImGuiViewportP *this;
  ImGuiViewportP **__dest;
  int iVar11;
  int iVar12;
  long lVar13;
  ImGuiContext *g;
  uint uVar14;
  uint uVar15;
  ImVec2 IVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  ulong uVar25;
  
  pIVar8 = GImGui;
  if (id == 0) {
    __assert_fail("id != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x2f0d,
                  "ImGuiViewportP *ImGui::AddUpdateViewport(ImGuiWindow *, ImGuiID, const ImVec2 &, const ImVec2 &, ImGuiViewportFlags)"
                 );
  }
  uVar14 = flags | 1;
  if (window != (ImGuiWindow *)0x0) {
    if ((GImGui->MovingWindow != (ImGuiWindow *)0x0) &&
       (GImGui->MovingWindow->RootWindowDockTree == window)) {
      uVar14 = flags | 0xa1;
    }
    uVar15 = uVar14 | 0x80;
    if ((~window->Flags & 0x40200U) != 0) {
      uVar15 = uVar14;
    }
    uVar14 = (uint)window->Flags >> 7 & 0x20 | uVar15;
  }
  lVar10 = (long)(GImGui->Viewports).Size;
  if (0 < lVar10) {
    lVar13 = 0;
    do {
      this = (GImGui->Viewports).Data[lVar13];
      if ((this->super_ImGuiViewport).ID == id) {
        if ((this->super_ImGuiViewport).PlatformRequestMove == false) {
          (this->super_ImGuiViewport).Pos = *pos;
        }
        if ((this->super_ImGuiViewport).PlatformRequestResize == true) {
          IVar16 = (this->super_ImGuiViewport).Size;
        }
        else {
          IVar16 = *size;
          (this->super_ImGuiViewport).Size = IVar16;
        }
        (this->super_ImGuiViewport).Flags = (this->super_ImGuiViewport).Flags & 0x400U | uVar14;
        IVar4 = (this->super_ImGuiViewport).Pos;
        fVar19 = IVar4.x;
        fVar20 = IVar4.y;
        goto LAB_00136665;
      }
      lVar13 = lVar13 + 1;
    } while (lVar10 != lVar13);
    if (GImGui == (ImGuiContext *)0x0) goto LAB_0013647a;
  }
  piVar1 = &(GImGui->IO).MetricsActiveAllocations;
  *piVar1 = *piVar1 + 1;
LAB_0013647a:
  this = (ImGuiViewportP *)(*GImAllocatorAllocFunc)(0x130,GImAllocatorUserData);
  ImGuiViewportP::ImGuiViewportP(this);
  (this->super_ImGuiViewport).ID = id;
  *(int *)&(this->super_ImGuiViewport).field_0x5c = (pIVar8->Viewports).Size;
  IVar16 = *pos;
  this->LastPos = IVar16;
  (this->super_ImGuiViewport).Pos = IVar16;
  (this->super_ImGuiViewport).Size = *size;
  (this->super_ImGuiViewport).Flags = uVar14;
  UpdateViewportPlatformMonitor(this);
  iVar9 = (pIVar8->Viewports).Size;
  if (iVar9 == (pIVar8->Viewports).Capacity) {
    if (iVar9 == 0) {
      iVar11 = 8;
    }
    else {
      iVar11 = iVar9 / 2 + iVar9;
    }
    iVar12 = iVar9 + 1;
    if (iVar9 + 1 < iVar11) {
      iVar12 = iVar11;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    __dest = (ImGuiViewportP **)(*GImAllocatorAllocFunc)((long)iVar12 << 3,GImAllocatorUserData);
    ppIVar7 = (pIVar8->Viewports).Data;
    if (ppIVar7 != (ImGuiViewportP **)0x0) {
      memcpy(__dest,ppIVar7,(long)(pIVar8->Viewports).Size << 3);
      ppIVar7 = (pIVar8->Viewports).Data;
      if ((ppIVar7 != (ImGuiViewportP **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar7,GImAllocatorUserData);
    }
    (pIVar8->Viewports).Data = __dest;
    (pIVar8->Viewports).Capacity = iVar12;
    iVar9 = (pIVar8->Viewports).Size;
  }
  else {
    __dest = (pIVar8->Viewports).Data;
  }
  __dest[iVar9] = this;
  (pIVar8->Viewports).Size = (pIVar8->Viewports).Size + 1;
  IVar16 = (this->super_ImGuiViewport).Pos;
  fVar19 = IVar16.x;
  fVar20 = IVar16.y;
  uVar2 = (pIVar8->DrawListSharedData).ClipRectFullscreen.x;
  uVar5 = (pIVar8->DrawListSharedData).ClipRectFullscreen.y;
  auVar17._4_4_ = uVar5;
  auVar17._0_4_ = uVar2;
  auVar17._8_8_ = 0;
  uVar3 = (pIVar8->DrawListSharedData).ClipRectFullscreen.z;
  uVar6 = (pIVar8->DrawListSharedData).ClipRectFullscreen.w;
  auVar18._8_8_ = 0;
  auVar18._0_4_ = IVar16.x;
  auVar18._4_4_ = IVar16.y;
  auVar18 = minps(auVar17,auVar18);
  (pIVar8->DrawListSharedData).ClipRectFullscreen.x = (float)(int)auVar18._0_8_;
  (pIVar8->DrawListSharedData).ClipRectFullscreen.y = (float)(int)((ulong)auVar18._0_8_ >> 0x20);
  IVar16 = (this->super_ImGuiViewport).Size;
  fVar23 = fVar19 + IVar16.x;
  fVar24 = fVar20 + IVar16.y;
  uVar14 = -(uint)(fVar23 <= (float)uVar3);
  uVar15 = -(uint)(fVar24 <= (float)uVar6);
  uVar25 = CONCAT44(~uVar15 & (uint)fVar24,~uVar14 & (uint)fVar23) |
           CONCAT44(uVar6 & uVar15,uVar3 & uVar14);
  (pIVar8->DrawListSharedData).ClipRectFullscreen.z = (float)(int)uVar25;
  (pIVar8->DrawListSharedData).ClipRectFullscreen.w = (float)(int)(uVar25 >> 0x20);
  uVar14 = (uint)this->PlatformMonitor;
  if (uVar14 != 0xffffffff) {
    if ((this->PlatformMonitor < 0) || ((pIVar8->PlatformIO).Monitors.Size <= (int)uVar14)) {
      __assert_fail("i >= 0 && i < Size",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.h"
                    ,0x706,
                    "T &ImVector<ImGuiPlatformMonitor>::operator[](int) [T = ImGuiPlatformMonitor]")
      ;
    }
    (this->super_ImGuiViewport).DpiScale = (pIVar8->PlatformIO).Monitors.Data[uVar14].DpiScale;
  }
LAB_00136665:
  this->Window = window;
  this->LastFrameActive = pIVar8->FrameCount;
  fVar21 = (this->WorkOffsetMin).x;
  fVar22 = (this->WorkOffsetMin).y;
  fVar23 = (IVar16.x - fVar21) + (this->WorkOffsetMax).x;
  fVar24 = (IVar16.y - fVar22) + (this->WorkOffsetMax).y;
  (this->super_ImGuiViewport).WorkPos.x = fVar19 + fVar21;
  (this->super_ImGuiViewport).WorkPos.y = fVar20 + fVar22;
  (this->super_ImGuiViewport).WorkSize.x = (float)(-(uint)(0.0 < fVar23) & (uint)fVar23);
  (this->super_ImGuiViewport).WorkSize.y = (float)(-(uint)(0.0 < fVar24) & (uint)fVar24);
  if (window != (ImGuiWindow *)0x0) {
    if ((this->super_ImGuiViewport).ID != window->ID) {
      __assert_fail("window == __null || viewport->ID == window->ID",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x2f40,
                    "ImGuiViewportP *ImGui::AddUpdateViewport(ImGuiWindow *, ImGuiID, const ImVec2 &, const ImVec2 &, ImGuiViewportFlags)"
                   );
    }
    window->ViewportOwned = true;
  }
  return this;
}

Assistant:

ImGuiViewportP* ImGui::AddUpdateViewport(ImGuiWindow* window, ImGuiID id, const ImVec2& pos, const ImVec2& size, ImGuiViewportFlags flags)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(id != 0);

    flags |= ImGuiViewportFlags_IsPlatformWindow;
    if (window != NULL)
    {
        if (g.MovingWindow && g.MovingWindow->RootWindowDockTree == window)
            flags |= ImGuiViewportFlags_NoInputs | ImGuiViewportFlags_NoFocusOnAppearing;
        if ((window->Flags & ImGuiWindowFlags_NoMouseInputs) && (window->Flags & ImGuiWindowFlags_NoNavInputs))
            flags |= ImGuiViewportFlags_NoInputs;
        if (window->Flags & ImGuiWindowFlags_NoFocusOnAppearing)
            flags |= ImGuiViewportFlags_NoFocusOnAppearing;
    }

    ImGuiViewportP* viewport = (ImGuiViewportP*)FindViewportByID(id);
    if (viewport)
    {
        if (!viewport->PlatformRequestMove)
            viewport->Pos = pos;
        if (!viewport->PlatformRequestResize)
            viewport->Size = size;
        viewport->Flags = flags | (viewport->Flags & ImGuiViewportFlags_Minimized); // Preserve existing flags
    }
    else
    {
        // New viewport
        viewport = IM_NEW(ImGuiViewportP)();
        viewport->ID = id;
        viewport->Idx = g.Viewports.Size;
        viewport->Pos = viewport->LastPos = pos;
        viewport->Size = size;
        viewport->Flags = flags;
        UpdateViewportPlatformMonitor(viewport);
        g.Viewports.push_back(viewport);
        IMGUI_DEBUG_LOG_VIEWPORT("Add Viewport %08X (%s)\n", id, window->Name);

        // We normally setup for all viewports in NewFrame() but here need to handle the mid-frame creation of a new viewport.
        // We need to extend the fullscreen clip rect so the OverlayDrawList clip is correct for that the first frame
        g.DrawListSharedData.ClipRectFullscreen.x = ImMin(g.DrawListSharedData.ClipRectFullscreen.x, viewport->Pos.x);
        g.DrawListSharedData.ClipRectFullscreen.y = ImMin(g.DrawListSharedData.ClipRectFullscreen.y, viewport->Pos.y);
        g.DrawListSharedData.ClipRectFullscreen.z = ImMax(g.DrawListSharedData.ClipRectFullscreen.z, viewport->Pos.x + viewport->Size.x);
        g.DrawListSharedData.ClipRectFullscreen.w = ImMax(g.DrawListSharedData.ClipRectFullscreen.w, viewport->Pos.y + viewport->Size.y);

        // Store initial DpiScale before the OS platform window creation, based on expected monitor data.
        // This is so we can select an appropriate font size on the first frame of our window lifetime
        if (viewport->PlatformMonitor != -1)
            viewport->DpiScale = g.PlatformIO.Monitors[viewport->PlatformMonitor].DpiScale;
    }

    viewport->Window = window;
    viewport->LastFrameActive = g.FrameCount;
    viewport->UpdateWorkRect();
    IM_ASSERT(window == NULL || viewport->ID == window->ID);

    if (window != NULL)
        window->ViewportOwned = true;

    return viewport;
}